

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O1

void __thiscall duckdb::ARTMerger::MergeNodes(ARTMerger *this,NodeEntry *entry)

{
  uint8_t uVar1;
  idx_t iVar2;
  idx_t iVar3;
  uchar *puVar4;
  unsafe_optional_ptr<Node> uVar5;
  reference pvVar6;
  Node *pNVar7;
  Node __tmp;
  size_type __n;
  vector<unsigned_long,_true> remaining;
  NodeChildren children;
  unsigned_long local_70;
  vector<unsigned_long,_true> local_68;
  NodeChildren local_50;
  
  pNVar7 = entry->right;
  iVar2 = (entry->left->super_IndexPointer).data;
  iVar3 = (pNVar7->super_IndexPointer).data;
  if (((byte)(iVar2 >> 0x38) & 0x7f) < ((byte)(iVar3 >> 0x38) & 0x7f)) {
    (entry->left->super_IndexPointer).data = iVar3;
    (pNVar7->super_IndexPointer).data = iVar2;
  }
  ExtractChildren(&local_50,this,entry->right);
  Node::Free(this->art,entry->right);
  local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (unsigned_long *)0x0;
  local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_70 = 0;
  if (local_50.bytes.count != 0) {
    do {
      puVar4 = array_ptr<unsigned_char,_true>::operator[](&local_50.bytes,local_70);
      uVar1 = *puVar4;
      uVar5 = GetChildInternal<duckdb::Node_const>(this->art,entry->left,uVar1);
      if (uVar5.ptr == (Node *)0x0) {
        pNVar7 = array_ptr<duckdb::Node,_true>::operator[](&local_50.children,local_70);
        Node::InsertChild(this->art,entry->left,uVar1,(Node)(pNVar7->super_IndexPointer).data);
      }
      else if (local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                   (iterator)
                   local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_70;
        local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_70 = local_70 + 1;
    } while (local_70 < local_50.bytes.count);
  }
  if (local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar6 = vector<unsigned_long,_true>::operator[](&local_68,__n);
      puVar4 = array_ptr<unsigned_char,_true>::operator[](&local_50.bytes,*pvVar6);
      uVar1 = *puVar4;
      pvVar6 = vector<unsigned_long,_true>::operator[](&local_68,__n);
      pNVar7 = array_ptr<duckdb::Node,_true>::operator[](&local_50.children,*pvVar6);
      uVar5 = GetChildInternal<duckdb::Node_const>(this->art,entry->left,uVar1);
      Emplace(this,uVar5.ptr,pNVar7,entry->status,entry->depth + 1);
      __n = __n + 1;
    } while (__n < (ulong)((long)local_68.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ARTMerger::MergeNodes(NodeEntry &entry) {
	D_ASSERT(entry.left.IsNode());
	D_ASSERT(entry.right.IsNode());

	// Merge the smaller node into the bigger node.
	if (entry.left.GetType() < entry.right.GetType()) {
		swap(entry.left, entry.right);
	}

	// Get the children of the right node.
	// Then, copy them into left.
	auto children = ExtractChildren(entry.right);
	// As long as the arena is valid,
	// the copied-out nodes (and their references) are valid.
	Node::Free(art, entry.right);

	// First, we iterate and insert children.
	// This might grow the node, so we need to do it prior to Emplace.
	vector<idx_t> remaining;
	for (idx_t i = 0; i < children.bytes.size(); i++) {
		const auto byte = children.bytes[i];
		auto child = entry.left.GetChildMutable(art, byte);

		if (!child) {
			// There is no child at this byte.
			// We can insert the right node's child at byte and are done.
			auto &right_child = children.children[i];
			Node::InsertChild(art, entry.left, byte, right_child);
			continue;
		}
		// There is a left and a right child at this byte.
		// We remember to emplace the two children.
		remaining.emplace_back(i);
	}

	// Emplace all remaining children.
	for (idx_t i = 0; i < remaining.size(); i++) {
		const auto byte = children.bytes[remaining[i]];
		auto &right_child = children.children[remaining[i]];
		auto child = entry.left.GetChildMutable(art, byte);
		Emplace(*child, right_child, entry.status, entry.depth + 1);
	}
}